

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

uint64_t modinv2p64(uint64_t x)

{
  secp256k1_scalar *a;
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  uint uVar4;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  uint32_t uVar5;
  uint64_t uVar6;
  ulong uVar7;
  long lVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint64_t extraout_RAX;
  uint64_t extraout_RAX_00;
  byte bVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  secp256k1_modinv32_signed30 *b;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  long lVar16;
  secp256k1_modinv32_signed30 *a_00;
  int *extraout_RDX;
  uint *extraout_RDX_00;
  int32_t *piVar17;
  secp256k1_modinv32_signed30 *b_00;
  long *extraout_RDX_01;
  uint uVar18;
  secp256k1_modinv32_modinfo *unaff_RBX;
  secp256k1_modinv32_modinfo *psVar19;
  int *piVar20;
  secp256k1_modinv32_signed30 *psVar21;
  secp256k1_fe *psVar22;
  uint uVar23;
  uint uVar24;
  secp256k1_modinv32_modinfo *unaff_RBP;
  uint8_t *puVar25;
  uint uVar26;
  uint uVar27;
  secp256k1_modinv32_modinfo *in_RSI;
  secp256k1_modinv32_modinfo *psVar28;
  long lVar29;
  secp256k1_modinv32_signed30 *psVar30;
  secp256k1_fe *psVar31;
  secp256k1_fe *psVar32;
  secp256k1_fe *r;
  secp256k1_modinv32_modinfo *a_01;
  secp256k1_modinv32_modinfo *psVar33;
  secp256k1_modinv32_signed30 *a_02;
  secp256k1_modinv32_signed30 *a_03;
  long lVar34;
  ulong uVar35;
  secp256k1_fe *r_00;
  uchar *__s;
  uint uVar36;
  ulong uVar37;
  uint uVar38;
  secp256k1_modinv32_modinfo *psVar39;
  uint uVar40;
  int *piVar41;
  uint uVar42;
  secp256k1_modinv32_modinfo *unaff_R12;
  secp256k1_modinv32_modinfo *psVar43;
  secp256k1_modinv32_signed30 *psVar44;
  code *pcVar45;
  uint uVar46;
  ulong unaff_R13;
  secp256k1_modinv32_modinfo *psVar47;
  ulong uVar48;
  secp256k1_modinv32_signed30 *psVar49;
  size_t count;
  uint uVar50;
  secp256k1_modinv32_modinfo *unaff_R14;
  secp256k1_modinv32_modinfo *psVar51;
  secp256k1_modinv32_modinfo *psVar52;
  secp256k1_modinv32_modinfo *unaff_R15;
  secp256k1_modinv32_modinfo *modinfo;
  ulong uVar53;
  code *pcVar54;
  bool bVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  ulong uStack_1660;
  secp256k1_fe *psStack_1658;
  uchar auStack_1650 [4232];
  secp256k1_fe *psStack_5c8;
  code *pcStack_5c0;
  undefined8 uStack_5b8;
  secp256k1_fe *psStack_5b0;
  code *pcStack_5a8;
  code *pcStack_5a0;
  undefined1 auStack_598 [36];
  int iStack_574;
  int iStack_570;
  int iStack_56c;
  int iStack_568;
  int iStack_564;
  int iStack_560;
  int iStack_55c;
  undefined1 auStack_558 [48];
  code *pcStack_528;
  secp256k1_fe sStack_520;
  secp256k1_fe sStack_4f0;
  secp256k1_fe sStack_4c0;
  ulong uStack_488;
  ulong uStack_480;
  ulong uStack_478;
  secp256k1_modinv32_signed30 *psStack_470;
  ulong uStack_468;
  code *pcStack_460;
  uint uStack_458;
  uint uStack_454;
  uint uStack_450;
  uint uStack_44c;
  uint uStack_448;
  uint uStack_444;
  secp256k1_modinv32_signed30 *psStack_440;
  uint uStack_434;
  uint uStack_430;
  uint uStack_42c;
  uint uStack_428;
  int32_t iStack_424;
  secp256k1_modinv32_signed30 *psStack_420;
  secp256k1_modinv32_signed30 *psStack_418;
  secp256k1_modinv32_signed30 *psStack_410;
  secp256k1_modinv32_signed30 *psStack_408;
  secp256k1_modinv32_signed30 *psStack_400;
  code *pcStack_3f8;
  long lStack_3e8;
  long lStack_3e0;
  int *piStack_3d8;
  secp256k1_modinv32_modinfo *psStack_3d0;
  ulong uStack_3c8;
  ulong uStack_3b8;
  code *pcStack_3b0;
  secp256k1_modinv32_signed30 *psStack_3a8;
  int *piStack_398;
  secp256k1_modinv32_modinfo *psStack_390;
  ulong uStack_388;
  ulong uStack_378;
  code *pcStack_370;
  secp256k1_modinv32_signed30 sStack_368;
  secp256k1_modinv32_signed30 sStack_344;
  secp256k1_modinv32_modinfo *psStack_320;
  secp256k1_modinv32_modinfo *psStack_318;
  secp256k1_modinv32_modinfo *psStack_308;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  secp256k1_modinv32_modinfo sStack_2f0;
  secp256k1_modinv32_trans2x2 sStack_2c0;
  secp256k1_modinv32_modinfo sStack_2b0;
  secp256k1_modinv32_modinfo *psStack_280;
  long lStack_278;
  secp256k1_modinv32_modinfo sStack_270;
  secp256k1_modinv32_signed30 sStack_240;
  secp256k1_modinv32_modinfo *psStack_218;
  secp256k1_modinv32_modinfo *psStack_210;
  secp256k1_modinv32_modinfo *psStack_208;
  secp256k1_modinv32_modinfo *psStack_200;
  secp256k1_modinv32_modinfo *psStack_1f8;
  code *pcStack_1f0;
  uint uStack_1dc;
  secp256k1_modinv32_trans2x2 sStack_1d8;
  secp256k1_modinv32_modinfo sStack_1c8;
  uint uStack_19c;
  secp256k1_modinv32_modinfo sStack_198;
  secp256k1_modinv32_modinfo *psStack_170;
  secp256k1_modinv32_modinfo *psStack_168;
  secp256k1_modinv32_modinfo *psStack_160;
  secp256k1_modinv32_modinfo sStack_158;
  secp256k1_modinv32_signed30 sStack_128;
  secp256k1_modinv32_modinfo *psStack_100;
  secp256k1_modinv32_modinfo *psStack_f8;
  ulong uStack_f0;
  secp256k1_modinv32_modinfo *psStack_e8;
  secp256k1_modinv32_modinfo *psStack_e0;
  secp256k1_modinv32_modinfo *psStack_d8;
  uint uStack_c8;
  int iStack_c4;
  secp256k1_modinv32_trans2x2 sStack_c0;
  secp256k1_modinv32_modinfo sStack_b0;
  int iStack_84;
  secp256k1_modinv32_modinfo sStack_80;
  secp256k1_modinv32_modinfo *psStack_50;
  secp256k1_modinv32_modinfo *psStack_48;
  ulong uStack_40;
  
  if ((x & 1) != 0) {
    uVar6 = 1;
    iVar10 = 6;
    do {
      uVar6 = (2 - uVar6 * x) * uVar6;
      iVar10 = iVar10 + -1;
    } while (iVar10 != 0);
    return uVar6;
  }
  modinv2p64_cold_1();
  sStack_80.modulus.v[8] = (in_RSI->modulus).v[8];
  sStack_80.modulus.v._0_8_ = *(undefined8 *)(in_RSI->modulus).v;
  sStack_80.modulus.v._8_8_ = *(undefined8 *)((in_RSI->modulus).v + 2);
  sStack_80.modulus.v._16_8_ = *(undefined8 *)((in_RSI->modulus).v + 4);
  sStack_80.modulus.v._24_8_ = *(undefined8 *)((in_RSI->modulus).v + 6);
  uVar3 = *(undefined8 *)(((secp256k1_modinv32_modinfo *)x)->modulus).v;
  sStack_b0.modulus.v._8_8_ = *(undefined8 *)((((secp256k1_modinv32_modinfo *)x)->modulus).v + 2);
  piVar17 = (((secp256k1_modinv32_modinfo *)x)->modulus).v + 4;
  sStack_b0.modulus.v._16_8_ = *(undefined8 *)piVar17;
  sStack_b0.modulus.v._24_8_ = *(undefined8 *)((((secp256k1_modinv32_modinfo *)x)->modulus).v + 6);
  sStack_b0.modulus.v[0] = (int32_t)uVar3;
  sStack_b0.modulus.v[1] = (int32_t)((ulong)uVar3 >> 0x20);
  sStack_b0.modulus.v[8] = (((secp256k1_modinv32_modinfo *)x)->modulus).v[8];
  auVar59 = packssdw(*(undefined1 (*) [16])(((secp256k1_modinv32_modinfo *)x)->modulus).v,
                     *(undefined1 (*) [16])piVar17);
  psVar33 = in_RSI;
  if (((((((((auVar59 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar59 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar59 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar59 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
         (auVar59 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar59 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
       (auVar59 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar59[0xf]) &&
     (-1 < sStack_b0.modulus.v[8])) {
    uVar26 = sStack_b0.modulus.v[3] | sStack_b0.modulus.v[2] |
             sStack_b0.modulus.v[1] | sStack_b0.modulus.v[0];
    psVar33 = (secp256k1_modinv32_modinfo *)(ulong)uVar26;
    psVar52 = unaff_RBP;
    psVar51 = unaff_R14;
    if ((sStack_b0.modulus.v[7] != 0 ||
        ((sStack_b0.modulus.v[6] != 0 ||
         (sStack_b0.modulus.v[5] != 0 || sStack_b0.modulus.v[4] != 0)) || uVar26 != 0)) ||
        sStack_b0.modulus.v[8] != 0) {
      psVar51 = (secp256k1_modinv32_modinfo *)0x9;
      unaff_R13 = 0xffffffff;
      iStack_c4 = 0;
      unaff_R12 = (secp256k1_modinv32_modinfo *)0x0;
      psStack_50 = in_RSI;
      do {
        in_RSI = psStack_50;
        uVar18 = sStack_80.modulus.v[1] << 0x1e | sStack_80.modulus.v[0];
        unaff_RBX = (secp256k1_modinv32_modinfo *)(ulong)uVar18;
        uVar27 = sStack_b0.modulus.v[1] << 0x1e | sStack_b0.modulus.v[0];
        psVar33 = (secp256k1_modinv32_modinfo *)(ulong)uVar27;
        uVar26 = 1;
        psVar47 = (secp256k1_modinv32_modinfo *)0x0;
        uVar4 = 0x1e;
        x = 0;
        uVar36 = 1;
        unaff_RBP = unaff_RBX;
        psVar43 = unaff_R12;
        uVar38 = uVar27;
        while( true ) {
          uVar40 = (uint)unaff_RBP;
          uVar23 = -1 << ((byte)uVar4 & 0x1f) | uVar38;
          uVar11 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
            }
          }
          bVar9 = (byte)uVar11;
          uVar38 = uVar38 >> (bVar9 & 0x1f);
          uVar36 = uVar36 << (bVar9 & 0x1f);
          uVar23 = (int)x << (bVar9 & 0x1f);
          x = (uint64_t)uVar23;
          uVar46 = (int)unaff_R13 - uVar11;
          unaff_R13 = (ulong)uVar46;
          psVar52 = (secp256k1_modinv32_modinfo *)((ulong)unaff_RBP >> 1);
          uVar42 = ((uint)((ulong)unaff_RBP >> 2) ^ (uint)psVar52) & uVar11 ^ (uint)psVar43;
          unaff_R12 = (secp256k1_modinv32_modinfo *)(ulong)uVar42;
          uVar4 = uVar4 - uVar11;
          uVar11 = (uint)psVar47;
          psStack_48 = psVar51;
          if (uVar4 == 0) break;
          if (((ulong)unaff_RBP & 1) == 0) {
            psStack_d8 = (secp256k1_modinv32_modinfo *)0x14ade9;
            secp256k1_jacobi32_maybe_var_cold_6();
LAB_0014ade9:
            psStack_d8 = (secp256k1_modinv32_modinfo *)0x14adee;
            secp256k1_jacobi32_maybe_var_cold_5();
            unaff_R14 = psVar43;
LAB_0014adee:
            psStack_d8 = (secp256k1_modinv32_modinfo *)0x14adf3;
            secp256k1_jacobi32_maybe_var_cold_1();
LAB_0014adf3:
            unaff_RBP = psVar52;
            psStack_d8 = (secp256k1_modinv32_modinfo *)0x14adf8;
            secp256k1_jacobi32_maybe_var_cold_2();
LAB_0014adf8:
            psStack_d8 = (secp256k1_modinv32_modinfo *)0x14adfd;
            secp256k1_jacobi32_maybe_var_cold_4();
            goto LAB_0014adfd;
          }
          if ((uVar38 & 1) == 0) goto LAB_0014ade9;
          uVar24 = uVar23 * uVar27 + uVar36 * uVar18;
          psVar52 = (secp256k1_modinv32_modinfo *)(ulong)uVar24;
          bVar9 = 0x1e - (char)uVar4;
          uVar50 = uVar40 << (bVar9 & 0x1f);
          unaff_R14 = (secp256k1_modinv32_modinfo *)(ulong)uVar50;
          if (uVar24 != uVar50) goto LAB_0014adee;
          uVar50 = uVar26 * uVar27 + uVar11 * uVar18;
          unaff_R14 = (secp256k1_modinv32_modinfo *)(ulong)uVar50;
          uVar24 = uVar38 << (bVar9 & 0x1f);
          psVar52 = (secp256k1_modinv32_modinfo *)(ulong)uVar24;
          if (uVar50 != uVar24) goto LAB_0014adf3;
          unaff_R14 = psVar47;
          if ((int)uVar46 < 0) {
            unaff_R13 = (ulong)-uVar46;
            unaff_R12 = (secp256k1_modinv32_modinfo *)(ulong)(uVar42 ^ (uVar38 & uVar40) >> 1);
            unaff_RBP = (secp256k1_modinv32_modinfo *)(ulong)uVar38;
            x = (uint64_t)uVar26;
            unaff_R14 = (secp256k1_modinv32_modinfo *)(ulong)uVar36;
            uVar36 = uVar11;
            uVar38 = uVar40;
            uVar26 = uVar23;
          }
          unaff_R15 = (secp256k1_modinv32_modinfo *)(ulong)uVar26;
          uVar11 = (int)unaff_R13 + 1;
          if ((int)uVar4 <= (int)uVar11) {
            uVar11 = uVar4;
          }
          if (0x1e < uVar11) goto LAB_0014adf8;
          uVar11 = (uint)(0xff << (-(char)uVar11 & 0x1fU)) >> (-(char)uVar11 & 0x1fU);
          uVar40 = secp256k1_modinv32_inv256[(uint)((ulong)unaff_RBP >> 1) & 0x7f] * uVar38 & uVar11
          ;
          uVar38 = uVar40 * (int)unaff_RBP + uVar38;
          psVar47 = (secp256k1_modinv32_modinfo *)(ulong)(uVar40 * uVar36 + (int)unaff_R14);
          uVar26 = uVar40 * (int)x + uVar26;
          psVar43 = unaff_R12;
          uStack_40 = unaff_R13;
          if ((uVar38 & uVar11) != 0) {
LAB_0014adfd:
            psStack_d8 = (secp256k1_modinv32_modinfo *)0x14ae02;
            secp256k1_jacobi32_maybe_var_cold_3();
            goto LAB_0014ae02;
          }
        }
        lVar8 = (long)(int)uVar26 * (long)(int)uVar36 - (long)(int)uVar11 * (long)(int)uVar23;
        unaff_R15 = &sStack_80;
        sStack_c0.u = uVar36;
        sStack_c0.v = uVar23;
        sStack_c0.q = uVar11;
        sStack_c0.r = uVar26;
        if ((lVar8 != -0x40000000) && (lVar8 != 0x40000000)) goto LAB_0014ae34;
        iVar12 = (int)psVar51;
        psStack_d8 = (secp256k1_modinv32_modinfo *)0x14ac83;
        psVar33 = psVar51;
        x = (uint64_t)unaff_R15;
        iVar10 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar12,&psStack_50->modulus,0);
        unaff_RBP = &sStack_b0;
        if (iVar10 < 1) goto LAB_0014ae07;
        psStack_d8 = (secp256k1_modinv32_modinfo *)0x14aca3;
        psVar33 = psVar51;
        x = (uint64_t)unaff_R15;
        iVar10 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar12,&in_RSI->modulus,1);
        if (0 < iVar10) goto LAB_0014ae0c;
        psStack_d8 = (secp256k1_modinv32_modinfo *)0x14acbb;
        psVar33 = psVar51;
        x = (uint64_t)unaff_RBP;
        iVar10 = secp256k1_modinv32_mul_cmp_30(&unaff_RBP->modulus,iVar12,&in_RSI->modulus,0);
        if (iVar10 < 1) goto LAB_0014ae11;
        psStack_d8 = (secp256k1_modinv32_modinfo *)0x14acd6;
        psVar33 = psVar51;
        x = (uint64_t)unaff_RBP;
        iVar10 = secp256k1_modinv32_mul_cmp_30(&unaff_RBP->modulus,iVar12,&in_RSI->modulus,1);
        if (-1 < iVar10) goto LAB_0014ae16;
        psStack_d8 = (secp256k1_modinv32_modinfo *)0x14acf1;
        secp256k1_modinv32_update_fg_30_var
                  (iVar12,&unaff_R15->modulus,&unaff_RBP->modulus,&sStack_c0);
        if (sStack_80.modulus.v[0] == 1) {
          if (1 < iVar12) {
            uVar26 = 0;
            psVar33 = (secp256k1_modinv32_modinfo *)0x1;
            do {
              uVar26 = uVar26 | sStack_80.modulus.v[(long)psVar33];
              psVar33 = (secp256k1_modinv32_modinfo *)((long)(psVar33->modulus).v + 1);
            } while (psVar51 != psVar33);
            if (uVar26 != 0) goto LAB_0014ad20;
          }
          uStack_c8 = 1 - (uVar42 * 2 & 2);
          bVar55 = false;
        }
        else {
LAB_0014ad20:
          if ((-1 < iVar12 + -2 && (&iStack_84)[iVar12] == 0) &&
              sStack_b0.modulus.v[(long)iVar12 + -1] == 0) {
            psVar51 = (secp256k1_modinv32_modinfo *)(ulong)(iVar12 - 1);
          }
          psStack_d8 = (secp256k1_modinv32_modinfo *)0x14ad4a;
          iVar12 = (int)psVar51;
          psVar33 = psVar51;
          x = (uint64_t)unaff_R15;
          iVar10 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar12,&in_RSI->modulus,0);
          if (iVar10 < 1) goto LAB_0014ae1b;
          psStack_d8 = (secp256k1_modinv32_modinfo *)0x14ad65;
          psVar33 = psVar51;
          x = (uint64_t)unaff_R15;
          iVar10 = secp256k1_modinv32_mul_cmp_30(&unaff_R15->modulus,iVar12,&in_RSI->modulus,1);
          if (0 < iVar10) goto LAB_0014ae20;
          psStack_d8 = (secp256k1_modinv32_modinfo *)0x14ad7d;
          psVar33 = psVar51;
          x = (uint64_t)unaff_RBP;
          iVar10 = secp256k1_modinv32_mul_cmp_30(&unaff_RBP->modulus,iVar12,&in_RSI->modulus,0);
          if (iVar10 < 1) goto LAB_0014ae25;
          psStack_d8 = (secp256k1_modinv32_modinfo *)0x14ad98;
          psVar33 = psVar51;
          x = (uint64_t)unaff_RBP;
          iVar10 = secp256k1_modinv32_mul_cmp_30(&unaff_RBP->modulus,iVar12,&in_RSI->modulus,1);
          bVar55 = true;
          if (-1 < iVar10) goto LAB_0014ae2a;
        }
        if (!bVar55) goto LAB_0014add2;
        iStack_c4 = iStack_c4 + 1;
        if (iStack_c4 == 0x19) {
          uStack_c8 = 0;
LAB_0014add2:
          return (ulong)uStack_c8;
        }
      } while( true );
    }
  }
  else {
LAB_0014ae02:
    psStack_d8 = (secp256k1_modinv32_modinfo *)0x14ae07;
    secp256k1_jacobi32_maybe_var_cold_17();
    in_RSI = unaff_RBX;
    psVar51 = unaff_R14;
LAB_0014ae07:
    psStack_d8 = (secp256k1_modinv32_modinfo *)0x14ae0c;
    secp256k1_jacobi32_maybe_var_cold_14();
LAB_0014ae0c:
    psStack_d8 = (secp256k1_modinv32_modinfo *)0x14ae11;
    secp256k1_jacobi32_maybe_var_cold_13();
LAB_0014ae11:
    psStack_d8 = (secp256k1_modinv32_modinfo *)0x14ae16;
    secp256k1_jacobi32_maybe_var_cold_12();
LAB_0014ae16:
    psStack_d8 = (secp256k1_modinv32_modinfo *)0x14ae1b;
    secp256k1_jacobi32_maybe_var_cold_11();
LAB_0014ae1b:
    psStack_d8 = (secp256k1_modinv32_modinfo *)0x14ae20;
    secp256k1_jacobi32_maybe_var_cold_10();
LAB_0014ae20:
    psStack_d8 = (secp256k1_modinv32_modinfo *)0x14ae25;
    secp256k1_jacobi32_maybe_var_cold_9();
LAB_0014ae25:
    psStack_d8 = (secp256k1_modinv32_modinfo *)0x14ae2a;
    secp256k1_jacobi32_maybe_var_cold_8();
LAB_0014ae2a:
    psStack_d8 = (secp256k1_modinv32_modinfo *)0x14ae2f;
    secp256k1_jacobi32_maybe_var_cold_7();
    psVar52 = unaff_RBP;
  }
  psStack_d8 = (secp256k1_modinv32_modinfo *)0x14ae34;
  secp256k1_jacobi32_maybe_var_cold_16();
  psStack_50 = in_RSI;
LAB_0014ae34:
  psStack_d8 = (secp256k1_modinv32_modinfo *)secp256k1_modinv32_var;
  secp256k1_jacobi32_maybe_var_cold_15();
  psStack_d8 = psVar52;
  psStack_e0 = unaff_R15;
  psStack_e8 = psVar51;
  uStack_f0 = unaff_R13;
  psStack_f8 = unaff_R12;
  psStack_100 = psStack_50;
  psVar52 = (secp256k1_modinv32_modinfo *)0x0;
  sStack_158.modulus.v[8] = 0;
  sStack_158.modulus.v[4] = 0;
  sStack_158.modulus.v[5] = 0;
  sStack_158.modulus.v[6] = 0;
  sStack_158.modulus.v[7] = 0;
  sStack_158.modulus.v[0] = 0;
  sStack_158.modulus.v[1] = 0;
  sStack_158.modulus.v[2] = 0;
  sStack_158.modulus.v[3] = 0;
  sStack_128.v[2] = 0;
  sStack_128.v[3] = 0;
  sStack_128.v[8] = 0;
  sStack_128.v[4] = 0;
  sStack_128.v[5] = 0;
  sStack_128.v[6] = 0;
  sStack_128.v[7] = 0;
  sStack_128.v[0] = 1;
  sStack_128.v[1] = 0;
  sStack_1c8.modulus.v[8] = (psVar33->modulus).v[8];
  sStack_1c8.modulus.v._16_8_ = *(undefined8 *)((psVar33->modulus).v + 4);
  sStack_1c8.modulus.v._24_8_ = *(undefined8 *)((psVar33->modulus).v + 6);
  sStack_1c8.modulus.v._0_8_ = *(ulong *)(psVar33->modulus).v;
  sStack_1c8.modulus.v._8_8_ = *(undefined8 *)((psVar33->modulus).v + 2);
  sStack_198.modulus.v[8] = (((secp256k1_modinv32_modinfo *)x)->modulus).v[8];
  sStack_198.modulus.v._0_8_ = *(undefined8 *)(((secp256k1_modinv32_modinfo *)x)->modulus).v;
  sStack_198.modulus.v._8_8_ = *(undefined8 *)((((secp256k1_modinv32_modinfo *)x)->modulus).v + 2);
  psStack_170 = (secp256k1_modinv32_modinfo *)x;
  sStack_198.modulus.v._16_8_ = *(undefined8 *)((((secp256k1_modinv32_modinfo *)x)->modulus).v + 4);
  sStack_198.modulus.v._24_8_ = *(undefined8 *)((((secp256k1_modinv32_modinfo *)x)->modulus).v + 6);
  psVar43 = (secp256k1_modinv32_modinfo *)0xffffffff;
  psVar51 = (secp256k1_modinv32_modinfo *)0x9;
  puVar25 = secp256k1_modinv32_inv256;
  psStack_168 = psVar33;
  do {
    modinfo = psStack_168;
    uStack_1dc = (uint)psVar52;
    psVar28 = (secp256k1_modinv32_modinfo *)(sStack_1c8.modulus.v._0_8_ & 0xffffffff);
    a_01 = (secp256k1_modinv32_modinfo *)(sStack_198.modulus.v._0_8_ & 0xffffffff);
    uVar26 = 1;
    psVar39 = (secp256k1_modinv32_modinfo *)0x0;
    iVar10 = 0x1e;
    uVar4 = 0;
    psVar47 = (secp256k1_modinv32_modinfo *)0x1;
    uVar36 = sStack_1c8.modulus.v[0];
    uVar38 = sStack_198.modulus.v[0];
    while( true ) {
      uVar18 = -1 << ((byte)iVar10 & 0x1f) | uVar38;
      psVar19 = (secp256k1_modinv32_modinfo *)(ulong)uVar18;
      iVar12 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> iVar12 & 1) == 0; iVar12 = iVar12 + 1) {
        }
      }
      bVar9 = (byte)iVar12;
      uVar38 = uVar38 >> (bVar9 & 0x1f);
      uVar27 = (int)psVar47 << (bVar9 & 0x1f);
      psVar47 = (secp256k1_modinv32_modinfo *)(ulong)uVar27;
      uVar4 = uVar4 << (bVar9 & 0x1f);
      uVar18 = (int)psVar43 - iVar12;
      psVar43 = (secp256k1_modinv32_modinfo *)(ulong)uVar18;
      iVar10 = iVar10 - iVar12;
      iVar12 = (int)psVar39;
      psStack_160 = psVar51;
      if (iVar10 == 0) break;
      if ((uVar36 & 1) == 0) {
        pcStack_1f0 = (code *)0x14b313;
        secp256k1_modinv32_var_cold_7();
LAB_0014b313:
        pcStack_1f0 = (code *)0x14b318;
        secp256k1_modinv32_var_cold_6();
LAB_0014b318:
        pcStack_1f0 = (code *)0x14b31d;
        secp256k1_modinv32_var_cold_1();
LAB_0014b31d:
        pcStack_1f0 = (code *)0x14b322;
        secp256k1_modinv32_var_cold_2();
LAB_0014b322:
        pcStack_1f0 = (code *)0x14b327;
        secp256k1_modinv32_var_cold_5();
LAB_0014b327:
        pcStack_1f0 = (code *)0x14b32c;
        secp256k1_modinv32_var_cold_4();
        goto LAB_0014b32c;
      }
      if ((uVar38 & 1) == 0) goto LAB_0014b313;
      uVar11 = uVar4 * sStack_198.modulus.v[0] + uVar27 * sStack_1c8.modulus.v[0];
      psVar19 = (secp256k1_modinv32_modinfo *)(ulong)uVar11;
      bVar9 = 0x1e - (char)iVar10;
      uVar40 = uVar36 << (bVar9 & 0x1f);
      psVar52 = (secp256k1_modinv32_modinfo *)(ulong)uVar40;
      if (uVar11 != uVar40) goto LAB_0014b318;
      uVar40 = uVar26 * sStack_198.modulus.v[0] + iVar12 * sStack_1c8.modulus.v[0];
      psVar52 = (secp256k1_modinv32_modinfo *)(ulong)uVar40;
      uVar11 = uVar38 << (bVar9 & 0x1f);
      psVar19 = (secp256k1_modinv32_modinfo *)(ulong)uVar11;
      if (uVar40 != uVar11) goto LAB_0014b31d;
      if (uVar18 - 0x2f0 < 0xfffffa21) goto LAB_0014b322;
      psVar52 = psVar39;
      if ((int)uVar18 < 0) {
        psVar43 = (secp256k1_modinv32_modinfo *)(ulong)-uVar18;
        uVar18 = -uVar36;
        uVar11 = -uVar4;
        psVar47 = psVar39;
        psVar52 = (secp256k1_modinv32_modinfo *)(ulong)-uVar27;
        uVar36 = uVar38;
        uVar38 = uVar18;
        uVar4 = uVar26;
        uVar26 = uVar11;
      }
      psVar19 = (secp256k1_modinv32_modinfo *)(ulong)uVar26;
      iVar12 = (int)psVar43 + 1;
      if (iVar10 <= iVar12) {
        iVar12 = iVar10;
      }
      if (iVar12 - 0x1fU < 0xffffffe2) goto LAB_0014b327;
      uVar27 = (uint)(0xff << (-(char)iVar12 & 0x1fU)) >> (-(char)iVar12 & 0x1fU);
      psVar33 = (secp256k1_modinv32_modinfo *)(ulong)uVar27;
      uVar18 = secp256k1_modinv32_inv256[uVar36 >> 1 & 0x7f] * uVar38 & uVar27;
      uVar38 = uVar38 + uVar18 * uVar36;
      psVar39 = (secp256k1_modinv32_modinfo *)(ulong)(uVar18 * (int)psVar47 + (int)psVar52);
      uVar26 = uVar18 * uVar4 + uVar26;
      if ((uVar38 & uVar27) != 0) {
LAB_0014b32c:
        pcStack_1f0 = (code *)0x14b331;
        secp256k1_modinv32_var_cold_3();
        goto LAB_0014b331;
      }
    }
    sStack_1d8.u = uVar27;
    sStack_1d8.v = uVar4;
    sStack_1d8.q = iVar12;
    sStack_1d8.r = uVar26;
    if ((long)(int)uVar26 * (long)(int)uVar27 - (long)iVar12 * (long)(int)uVar4 != 0x40000000) {
LAB_0014b331:
      pcStack_1f0 = (code *)0x14b336;
      secp256k1_modinv32_var_cold_8();
      psVar51 = psVar19;
      modinfo = psVar33;
LAB_0014b336:
      pcStack_1f0 = (code *)0x14b33b;
      secp256k1_modinv32_var_cold_19();
LAB_0014b33b:
      pcStack_1f0 = (code *)0x14b340;
      secp256k1_modinv32_var_cold_18();
LAB_0014b340:
      pcStack_1f0 = (code *)0x14b345;
      secp256k1_modinv32_var_cold_17();
LAB_0014b345:
      pcStack_1f0 = (code *)0x14b34a;
      secp256k1_modinv32_var_cold_16();
LAB_0014b34a:
      pcStack_1f0 = (code *)0x14b34f;
      secp256k1_modinv32_var_cold_13();
LAB_0014b34f:
      pcStack_1f0 = (code *)0x14b354;
      secp256k1_modinv32_var_cold_12();
LAB_0014b354:
      pcStack_1f0 = (code *)0x14b359;
      secp256k1_modinv32_var_cold_11();
LAB_0014b359:
      pcStack_1f0 = (code *)0x14b35e;
      secp256k1_modinv32_var_cold_10();
LAB_0014b35e:
      pcStack_1f0 = (code *)0x14b363;
      secp256k1_modinv32_var_cold_9();
      goto LAB_0014b363;
    }
    pcStack_1f0 = (code *)0x14b078;
    secp256k1_modinv32_update_de_30(&sStack_158.modulus,&sStack_128,&sStack_1d8,psStack_168);
    psVar51 = psStack_160;
    psVar47 = &sStack_1c8;
    iVar12 = (int)psStack_160;
    psVar28 = (secp256k1_modinv32_modinfo *)((ulong)psStack_160 & 0xffffffff);
    pcStack_1f0 = (code *)0x14b097;
    a_01 = psVar47;
    iVar10 = secp256k1_modinv32_mul_cmp_30(&psVar47->modulus,iVar12,&modinfo->modulus,-1);
    if (iVar10 < 1) goto LAB_0014b336;
    psVar28 = (secp256k1_modinv32_modinfo *)((ulong)psVar51 & 0xffffffff);
    pcStack_1f0 = (code *)0x14b0b1;
    a_01 = psVar47;
    iVar10 = secp256k1_modinv32_mul_cmp_30(&psVar47->modulus,iVar12,&modinfo->modulus,1);
    if (0 < iVar10) goto LAB_0014b33b;
    psVar52 = &sStack_198;
    psVar28 = (secp256k1_modinv32_modinfo *)((ulong)psVar51 & 0xffffffff);
    pcStack_1f0 = (code *)0x14b0d0;
    a_01 = psVar52;
    iVar10 = secp256k1_modinv32_mul_cmp_30(&psVar52->modulus,iVar12,&modinfo->modulus,-1);
    if (iVar10 < 1) goto LAB_0014b340;
    psVar28 = (secp256k1_modinv32_modinfo *)((ulong)psVar51 & 0xffffffff);
    pcStack_1f0 = (code *)0x14b0ea;
    a_01 = psVar52;
    iVar10 = secp256k1_modinv32_mul_cmp_30(&psVar52->modulus,iVar12,&modinfo->modulus,1);
    if (-1 < iVar10) goto LAB_0014b345;
    pcStack_1f0 = (code *)0x14b104;
    secp256k1_modinv32_update_fg_30_var(iVar12,&psVar47->modulus,&psVar52->modulus,&sStack_1d8);
    uVar26 = uStack_1dc;
    psVar52 = (secp256k1_modinv32_modinfo *)(ulong)uStack_1dc;
    if (sStack_198.modulus.v[0] != 0) {
LAB_0014b114:
      uVar36 = sStack_1c8.modulus.v[(long)iVar12 + -1];
      uVar38 = (&uStack_19c)[iVar12];
      iVar10 = iVar12 + -2;
      uVar4 = (int)uVar36 >> 0x1f ^ uVar36 | iVar10 >> 0x1f;
      a_01 = (secp256k1_modinv32_modinfo *)(ulong)uVar4;
      uVar4 = (int)uVar38 >> 0x1f ^ uVar38 | uVar4;
      psVar28 = (secp256k1_modinv32_modinfo *)(ulong)uVar4;
      if (uVar4 == 0) {
        psVar51 = (secp256k1_modinv32_modinfo *)(ulong)(iVar12 - 1);
        piVar17 = sStack_1c8.modulus.v + iVar10;
        *piVar17 = *piVar17 | uVar36 << 0x1e;
        piVar17 = sStack_198.modulus.v + iVar10;
        *piVar17 = *piVar17 | uVar38 << 0x1e;
      }
      if (0x17 < (int)uStack_1dc) goto LAB_0014b34a;
      iVar12 = (int)psVar51;
      psVar28 = (secp256k1_modinv32_modinfo *)((ulong)psVar51 & 0xffffffff);
      pcStack_1f0 = (code *)0x14b16a;
      a_01 = psVar47;
      iVar10 = secp256k1_modinv32_mul_cmp_30(&psVar47->modulus,iVar12,&modinfo->modulus,-1);
      if (iVar10 < 1) goto LAB_0014b34f;
      psVar28 = (secp256k1_modinv32_modinfo *)((ulong)psVar51 & 0xffffffff);
      pcStack_1f0 = (code *)0x14b184;
      a_01 = psVar47;
      iVar10 = secp256k1_modinv32_mul_cmp_30(&psVar47->modulus,iVar12,&modinfo->modulus,1);
      if (0 < iVar10) goto LAB_0014b354;
      psVar47 = &sStack_198;
      psVar28 = (secp256k1_modinv32_modinfo *)((ulong)psVar51 & 0xffffffff);
      pcStack_1f0 = (code *)0x14b1a3;
      a_01 = psVar47;
      iVar10 = secp256k1_modinv32_mul_cmp_30(&psVar47->modulus,iVar12,&modinfo->modulus,-1);
      if (iVar10 < 1) goto LAB_0014b359;
      psVar28 = (secp256k1_modinv32_modinfo *)((ulong)psVar51 & 0xffffffff);
      pcStack_1f0 = (code *)0x14b1bd;
      a_01 = psVar47;
      iVar10 = secp256k1_modinv32_mul_cmp_30(&psVar47->modulus,iVar12,&modinfo->modulus,1);
      if (iVar10 < 0) {
        psVar52 = (secp256k1_modinv32_modinfo *)(ulong)(uVar26 + 1);
        uVar36 = 1;
        goto LAB_0014b1f0;
      }
      goto LAB_0014b35e;
    }
    uVar36 = 0;
    if (1 < iVar12) {
      uVar53 = 1;
      do {
        uVar36 = uVar36 | sStack_198.modulus.v[uVar53];
        uVar53 = uVar53 + 1;
      } while (((ulong)psVar51 & 0xffffffff) != uVar53);
      if (uVar36 != 0) goto LAB_0014b114;
      uVar36 = 0;
    }
LAB_0014b1f0:
    psVar33 = modinfo;
  } while ((char)uVar36 != '\0');
  a_01 = &sStack_198;
  iVar12 = (int)psVar51;
  psVar28 = (secp256k1_modinv32_modinfo *)((ulong)psVar51 & 0xffffffff);
  pcStack_1f0 = (code *)0x14b20d;
  iVar10 = secp256k1_modinv32_mul_cmp_30(&a_01->modulus,iVar12,&SECP256K1_SIGNED30_ONE,0);
  if (iVar10 == 0) {
    pcStack_1f0 = (code *)0x14b22d;
    iVar10 = secp256k1_modinv32_mul_cmp_30(&sStack_1c8.modulus,iVar12,&SECP256K1_SIGNED30_ONE,-1);
    psVar52 = psStack_170;
    if (iVar10 == 0) {
LAB_0014b2cb:
      pcStack_1f0 = (code *)0x14b2e5;
      secp256k1_modinv32_normalize_30
                (&sStack_158.modulus,sStack_1c8.modulus.v[(long)iVar12 + -1],modinfo);
      (psVar52->modulus).v[8] = sStack_158.modulus.v[8];
      *(undefined8 *)((psVar52->modulus).v + 4) = sStack_158.modulus.v._16_8_;
      *(undefined8 *)((psVar52->modulus).v + 6) = sStack_158.modulus.v._24_8_;
      *(undefined8 *)(psVar52->modulus).v = sStack_158.modulus.v._0_8_;
      *(undefined8 *)((psVar52->modulus).v + 2) = sStack_158.modulus.v._8_8_;
      return (ulong)(uint)sStack_158.modulus.v[8];
    }
    pcStack_1f0 = (code *)0x14b252;
    iVar10 = secp256k1_modinv32_mul_cmp_30(&sStack_1c8.modulus,iVar12,&SECP256K1_SIGNED30_ONE,1);
    if (iVar10 == 0) goto LAB_0014b2cb;
    psVar28 = (secp256k1_modinv32_modinfo *)0x9;
    pcStack_1f0 = (code *)0x14b26c;
    a_01 = psVar52;
    iVar10 = secp256k1_modinv32_mul_cmp_30(&psVar52->modulus,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar10 == 0) {
      a_01 = &sStack_158;
      psVar28 = (secp256k1_modinv32_modinfo *)0x9;
      pcStack_1f0 = (code *)0x14b28f;
      iVar10 = secp256k1_modinv32_mul_cmp_30(&a_01->modulus,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar10 == 0) {
        pcStack_1f0 = (code *)0x14b2ab;
        iVar10 = secp256k1_modinv32_mul_cmp_30(&sStack_1c8.modulus,iVar12,&modinfo->modulus,1);
        if (iVar10 == 0) goto LAB_0014b2cb;
        a_01 = &sStack_1c8;
        psVar28 = (secp256k1_modinv32_modinfo *)((ulong)psVar51 & 0xffffffff);
        pcStack_1f0 = (code *)0x14b2c3;
        iVar10 = secp256k1_modinv32_mul_cmp_30(&a_01->modulus,iVar12,&modinfo->modulus,-1);
        if (iVar10 == 0) goto LAB_0014b2cb;
      }
    }
  }
  else {
LAB_0014b363:
    pcStack_1f0 = (code *)0x14b368;
    secp256k1_modinv32_var_cold_14();
  }
  pcStack_1f0 = secp256k1_modinv32;
  secp256k1_modinv32_var_cold_15();
  pcStack_1f0 = (code *)secp256k1_modinv32_inv256;
  psStack_1f8 = modinfo;
  psStack_200 = psVar52;
  psStack_208 = psVar47;
  psStack_210 = psVar43;
  psStack_218 = psVar51;
  uVar26 = 0;
  sStack_270.modulus.v[8] = 0;
  sStack_270.modulus.v[4] = 0;
  sStack_270.modulus.v[5] = 0;
  sStack_270.modulus.v[6] = 0;
  sStack_270.modulus.v[7] = 0;
  sStack_270.modulus.v[0] = 0;
  sStack_270.modulus.v[1] = 0;
  sStack_270.modulus.v[2] = 0;
  sStack_270.modulus.v[3] = 0;
  sStack_240.v[2] = 0;
  sStack_240.v[3] = 0;
  sStack_240.v[8] = 0;
  sStack_240.v[4] = 0;
  sStack_240.v[5] = 0;
  sStack_240.v[6] = 0;
  sStack_240.v[7] = 0;
  sStack_240.v[0] = 1;
  sStack_240.v[1] = 0;
  sStack_2f0.modulus.v[8] = (psVar28->modulus).v[8];
  sStack_2f0.modulus.v._16_8_ = *(undefined8 *)((psVar28->modulus).v + 4);
  sStack_2f0.modulus.v._24_8_ = *(undefined8 *)((psVar28->modulus).v + 6);
  sStack_2f0.modulus.v._0_8_ = *(undefined8 *)(psVar28->modulus).v;
  sStack_2f0.modulus.v._8_8_ = *(undefined8 *)((psVar28->modulus).v + 2);
  sStack_2b0.modulus.v[8] = (a_01->modulus).v[8];
  sStack_2b0.modulus.v._0_8_ = *(undefined8 *)(a_01->modulus).v;
  sStack_2b0.modulus.v._8_8_ = *(undefined8 *)((a_01->modulus).v + 2);
  psStack_280 = a_01;
  sStack_2b0.modulus.v._16_8_ = *(undefined8 *)((a_01->modulus).v + 4);
  sStack_2b0.modulus.v._24_8_ = *(undefined8 *)((a_01->modulus).v + 6);
  uVar53 = 0xffffffff;
  psStack_308 = psVar28;
  do {
    lStack_278 = (long)sStack_2f0.modulus.v[0];
    uVar48 = (ulong)sStack_2b0.modulus.v[0];
    uVar14 = 0;
    psVar33 = (secp256k1_modinv32_modinfo *)0x1;
    uVar36 = 0;
    uVar18 = 0;
    uVar27 = 1;
    uVar38 = sStack_2b0.modulus.v[0];
    uVar4 = sStack_2f0.modulus.v[0];
    do {
      uVar11 = sStack_2f0.modulus.v[0];
      uStack_2fc = uVar26;
      if ((uVar4 & 1) == 0) {
        psStack_318 = (secp256k1_modinv32_modinfo *)0x14b843;
        secp256k1_modinv32_cold_17();
LAB_0014b843:
        psStack_318 = (secp256k1_modinv32_modinfo *)0x14b848;
        secp256k1_modinv32_cold_1();
LAB_0014b848:
        psStack_318 = (secp256k1_modinv32_modinfo *)0x14b84d;
        secp256k1_modinv32_cold_2();
        psVar47 = psVar43;
LAB_0014b84d:
        psStack_318 = (secp256k1_modinv32_modinfo *)0x14b852;
        secp256k1_modinv32_cold_16();
        goto LAB_0014b852;
      }
      uVar42 = (uint)psVar33;
      uVar23 = uVar36 * sStack_2b0.modulus.v[0] + uVar42 * sStack_2f0.modulus.v[0];
      puVar25 = (uint8_t *)(ulong)uVar23;
      uVar40 = uVar4 << ((byte)uVar14 & 0x1f);
      psVar51 = (secp256k1_modinv32_modinfo *)(ulong)uVar40;
      if (uVar23 != uVar40) goto LAB_0014b843;
      uVar23 = uVar27 * sStack_2b0.modulus.v[0] + uVar18 * sStack_2f0.modulus.v[0];
      puVar25 = (uint8_t *)(ulong)uVar23;
      uVar40 = uVar38 << ((byte)uVar14 & 0x1f);
      psVar51 = (secp256k1_modinv32_modinfo *)(ulong)uVar40;
      if (uVar23 != uVar40) goto LAB_0014b848;
      uStack_2f4 = (int)(uint)uVar53 >> 0x1f;
      puVar25 = (uint8_t *)(ulong)uStack_2f4;
      uStack_2f8 = uVar38 & 1;
      uVar40 = -uStack_2f8;
      psVar52 = (secp256k1_modinv32_modinfo *)(ulong)uVar40;
      uVar23 = uStack_2f4 & uVar40;
      psVar51 = (secp256k1_modinv32_modinfo *)(ulong)uVar23;
      uVar46 = (uint)uVar53 ^ uVar23;
      uVar53 = (ulong)uVar46;
      psVar47 = (secp256k1_modinv32_modinfo *)(ulong)(uVar46 - 0x25b);
      if (uVar46 - 0x25b < 0xfffffb4d) goto LAB_0014b84d;
      uVar53 = (ulong)(uVar46 - 1);
      uVar27 = uVar27 + ((uStack_2f4 ^ uVar36) - uStack_2f4 & uVar40);
      uVar36 = (uVar36 + (uVar27 & uVar23)) * 2;
      uVar18 = uVar18 + ((uStack_2f4 ^ uVar42) - uStack_2f4 & uVar40);
      uVar42 = (uVar42 + (uVar18 & uVar23)) * 2;
      psVar33 = (secp256k1_modinv32_modinfo *)(ulong)uVar42;
      uVar40 = ((uStack_2f4 ^ uVar4) - uStack_2f4 & uVar40) + uVar38;
      uVar38 = uVar40 >> 1;
      uVar40 = uVar40 & uVar23;
      psVar43 = (secp256k1_modinv32_modinfo *)(ulong)uVar40;
      uVar4 = uVar4 + uVar40;
      uVar40 = (int)uVar14 + 1;
      uVar14 = (ulong)uVar40;
    } while (uVar40 != 0x1e);
    psVar51 = (secp256k1_modinv32_modinfo *)(long)(int)uVar42;
    psVar52 = (secp256k1_modinv32_modinfo *)(long)(int)uVar27;
    puVar25 = (uint8_t *)(long)(int)uVar36;
    psVar47 = (secp256k1_modinv32_modinfo *)(long)(int)uVar18;
    uVar14 = (long)psVar51 * (long)psVar52 - (long)puVar25 * (long)psVar47;
    sStack_2c0.u = uVar42;
    sStack_2c0.v = uVar36;
    sStack_2c0.q = uVar18;
    sStack_2c0.r = uVar27;
    if (uVar14 != 0x40000000) {
LAB_0014b852:
      psStack_318 = (secp256k1_modinv32_modinfo *)0x14b857;
      secp256k1_modinv32_cold_3();
LAB_0014b857:
      psStack_318 = (secp256k1_modinv32_modinfo *)0x14b85c;
      secp256k1_modinv32_cold_15();
LAB_0014b85c:
      psStack_318 = (secp256k1_modinv32_modinfo *)0x14b861;
      secp256k1_modinv32_cold_14();
LAB_0014b861:
      psStack_318 = (secp256k1_modinv32_modinfo *)0x14b866;
      secp256k1_modinv32_cold_13();
LAB_0014b866:
      psStack_318 = (secp256k1_modinv32_modinfo *)0x14b86b;
      secp256k1_modinv32_cold_12();
LAB_0014b86b:
      psStack_318 = (secp256k1_modinv32_modinfo *)0x14b870;
      secp256k1_modinv32_cold_4();
LAB_0014b870:
      psVar43 = psVar47;
      uVar26 = (uint)uVar14;
      psStack_318 = (secp256k1_modinv32_modinfo *)0x14b875;
      secp256k1_modinv32_cold_5();
LAB_0014b875:
      psStack_318 = (secp256k1_modinv32_modinfo *)0x14b87a;
      secp256k1_modinv32_cold_11();
LAB_0014b87a:
      psStack_318 = (secp256k1_modinv32_modinfo *)0x14b87f;
      secp256k1_modinv32_cold_10();
LAB_0014b87f:
      psStack_318 = (secp256k1_modinv32_modinfo *)0x14b884;
      secp256k1_modinv32_cold_9();
LAB_0014b884:
      psStack_318 = (secp256k1_modinv32_modinfo *)0x14b889;
      secp256k1_modinv32_cold_8();
      goto LAB_0014b889;
    }
    psStack_318 = (secp256k1_modinv32_modinfo *)0x14b556;
    secp256k1_modinv32_update_de_30(&sStack_270.modulus,&sStack_240,&sStack_2c0,psStack_308);
    psVar33 = &sStack_2f0;
    uVar11 = 9;
    uVar14 = 0xffffffff;
    psStack_318 = (secp256k1_modinv32_modinfo *)0x14b56f;
    iVar10 = secp256k1_modinv32_mul_cmp_30(&psVar33->modulus,9,&psStack_308->modulus,-1);
    if (iVar10 < 1) goto LAB_0014b857;
    psVar33 = &sStack_2f0;
    uVar11 = 9;
    uVar14 = 1;
    psStack_318 = (secp256k1_modinv32_modinfo *)0x14b590;
    iVar10 = secp256k1_modinv32_mul_cmp_30(&psVar33->modulus,9,&psStack_308->modulus,1);
    if (0 < iVar10) goto LAB_0014b85c;
    psVar33 = &sStack_2b0;
    uVar11 = 9;
    uVar14 = 0xffffffff;
    psStack_318 = (secp256k1_modinv32_modinfo *)0x14b5b1;
    iVar10 = secp256k1_modinv32_mul_cmp_30(&psVar33->modulus,9,&psStack_308->modulus,-1);
    if (iVar10 < 1) goto LAB_0014b861;
    psVar33 = &sStack_2b0;
    uVar11 = 9;
    uVar14 = 1;
    psStack_318 = (secp256k1_modinv32_modinfo *)0x14b5d2;
    iVar10 = secp256k1_modinv32_mul_cmp_30(&psVar33->modulus,9,&psStack_308->modulus,1);
    psVar43 = psStack_308;
    if (-1 < iVar10) goto LAB_0014b866;
    uVar14 = (long)psVar51 * lStack_278;
    uVar7 = (long)puVar25 * uVar48 + uVar14;
    if ((uVar7 & 0x3ffffffe) != 0) goto LAB_0014b86b;
    uVar48 = uVar48 * (long)psVar52 + lStack_278 * (long)psVar47;
    if ((uVar48 & 0x3fffffff) != 0) goto LAB_0014b870;
    uVar48 = (long)uVar48 >> 0x1e;
    lVar8 = (long)uVar7 >> 0x1e;
    lVar15 = 1;
    do {
      lVar16 = (long)sStack_2f0.modulus.v[lVar15];
      lVar29 = (long)sStack_2b0.modulus.v[lVar15];
      lVar8 = lVar29 * (long)puVar25 + lVar16 * (long)psVar51 + lVar8;
      lVar16 = lVar29 * (long)psVar52 + lVar16 * (long)psVar47 + uVar48;
      (&uStack_2f4)[lVar15] = (uint)lVar8 & 0x3fffffff;
      sStack_2b0.modulus.v[lVar15 + -1] = (uint)lVar16 & 0x3fffffff;
      lVar15 = lVar15 + 1;
      uVar48 = lVar16 >> 0x1e;
      lVar8 = lVar8 >> 0x1e;
    } while (lVar15 != 9);
    sStack_2f0.modulus.v[8] = (int32_t)lVar8;
    sStack_2b0.modulus.v[8] = (int32_t)uVar48;
    psVar51 = &sStack_2f0;
    uVar11 = 9;
    uVar26 = 0xffffffff;
    psStack_318 = (secp256k1_modinv32_modinfo *)0x14b6a6;
    psVar33 = psVar51;
    iVar10 = secp256k1_modinv32_mul_cmp_30(&psVar51->modulus,9,&psStack_308->modulus,-1);
    if (iVar10 < 1) goto LAB_0014b875;
    uVar11 = 9;
    uVar26 = 1;
    psStack_318 = (secp256k1_modinv32_modinfo *)0x14b6c3;
    psVar33 = psVar51;
    iVar10 = secp256k1_modinv32_mul_cmp_30(&psVar51->modulus,9,&psVar43->modulus,1);
    if (0 < iVar10) goto LAB_0014b87a;
    psVar51 = &sStack_2b0;
    uVar11 = 9;
    uVar26 = 0xffffffff;
    psStack_318 = (secp256k1_modinv32_modinfo *)0x14b6e5;
    psVar33 = psVar51;
    iVar10 = secp256k1_modinv32_mul_cmp_30(&psVar51->modulus,9,&psVar43->modulus,-1);
    if (iVar10 < 1) goto LAB_0014b87f;
    uVar11 = 9;
    psStack_318 = (secp256k1_modinv32_modinfo *)0x14b702;
    psVar33 = psVar51;
    iVar10 = secp256k1_modinv32_mul_cmp_30(&psVar51->modulus,9,&psVar43->modulus,1);
    uVar26 = uStack_2fc;
    if (-1 < iVar10) goto LAB_0014b884;
    uVar26 = uStack_2fc + 1;
  } while (uVar26 != 0x14);
  psVar33 = &sStack_2b0;
  uVar11 = 9;
  uVar26 = 0;
  psStack_318 = (secp256k1_modinv32_modinfo *)0x14b731;
  iVar10 = secp256k1_modinv32_mul_cmp_30(&psVar33->modulus,9,&SECP256K1_SIGNED30_ONE,0);
  if (iVar10 == 0) {
    psStack_318 = (secp256k1_modinv32_modinfo *)0x14b754;
    iVar10 = secp256k1_modinv32_mul_cmp_30(&sStack_2f0.modulus,9,&SECP256K1_SIGNED30_ONE,-1);
    psVar52 = psStack_280;
    if (iVar10 == 0) {
LAB_0014b7fe:
      psStack_318 = (secp256k1_modinv32_modinfo *)0x14b815;
      secp256k1_modinv32_normalize_30(&sStack_270.modulus,sStack_2f0.modulus.v[8],psVar43);
      (psVar52->modulus).v[8] = sStack_270.modulus.v[8];
      *(undefined8 *)((psVar52->modulus).v + 4) = sStack_270.modulus.v._16_8_;
      *(undefined8 *)((psVar52->modulus).v + 6) = sStack_270.modulus.v._24_8_;
      *(undefined8 *)(psVar52->modulus).v = sStack_270.modulus.v._0_8_;
      *(undefined8 *)((psVar52->modulus).v + 2) = sStack_270.modulus.v._8_8_;
      return (ulong)(uint)sStack_270.modulus.v[8];
    }
    psStack_318 = (secp256k1_modinv32_modinfo *)0x14b77f;
    iVar10 = secp256k1_modinv32_mul_cmp_30(&sStack_2f0.modulus,9,&SECP256K1_SIGNED30_ONE,1);
    if (iVar10 == 0) goto LAB_0014b7fe;
    uVar11 = 9;
    uVar26 = 0;
    psStack_318 = (secp256k1_modinv32_modinfo *)0x14b799;
    psVar33 = psVar52;
    iVar10 = secp256k1_modinv32_mul_cmp_30(&psVar52->modulus,9,&SECP256K1_SIGNED30_ONE,0);
    if (iVar10 == 0) {
      psVar33 = &sStack_270;
      uVar11 = 9;
      uVar26 = 0;
      psStack_318 = (secp256k1_modinv32_modinfo *)0x14b7bc;
      iVar10 = secp256k1_modinv32_mul_cmp_30(&psVar33->modulus,9,&SECP256K1_SIGNED30_ONE,0);
      if (iVar10 == 0) {
        psStack_318 = (secp256k1_modinv32_modinfo *)0x14b7db;
        iVar10 = secp256k1_modinv32_mul_cmp_30(&sStack_2f0.modulus,9,&psVar43->modulus,1);
        if (iVar10 == 0) goto LAB_0014b7fe;
        psVar33 = &sStack_2f0;
        uVar11 = 9;
        uVar26 = 0xffffffff;
        psStack_318 = (secp256k1_modinv32_modinfo *)0x14b7f6;
        iVar10 = secp256k1_modinv32_mul_cmp_30(&psVar33->modulus,9,&psVar43->modulus,-1);
        if (iVar10 == 0) goto LAB_0014b7fe;
      }
    }
  }
  else {
LAB_0014b889:
    psStack_318 = (secp256k1_modinv32_modinfo *)0x14b88e;
    secp256k1_modinv32_cold_6();
  }
  psStack_318 = (secp256k1_modinv32_modinfo *)secp256k1_modinv32_mul_cmp_30;
  secp256k1_modinv32_cold_7();
  a_02 = &sStack_368;
  piVar20 = (int *)(ulong)uVar26;
  pcStack_370 = (code *)0x14b8b3;
  psStack_320 = psVar51;
  psStack_318 = psVar52;
  secp256k1_modinv32_mul_30(&sStack_344,&psVar33->modulus,uVar11,1);
  pcStack_370 = (code *)0x14b8c5;
  piVar41 = piVar20;
  psVar30 = a_00;
  secp256k1_modinv32_mul_30(&sStack_368,a_00,9,uVar26);
  lVar8 = 0;
  while ((uint)sStack_344.v[lVar8] < 0x40000000) {
    if (0x3fffffff < (uint)sStack_368.v[lVar8]) goto LAB_0014b917;
    lVar8 = lVar8 + 1;
    if (lVar8 == 8) {
      uVar26 = 8;
      while( true ) {
        if (sStack_344.v[uVar26] < sStack_368.v[uVar26]) {
          return 0xffffffff;
        }
        if (sStack_368.v[uVar26] < sStack_344.v[uVar26]) break;
        bVar55 = uVar26 == 0;
        uVar26 = uVar26 - 1;
        if (bVar55) {
          return 0;
        }
      }
      return 1;
    }
  }
  pcStack_370 = (code *)0x14b917;
  secp256k1_modinv32_mul_cmp_30_cold_2();
LAB_0014b917:
  pcStack_370 = secp256k1_modinv32_update_fg_30_var;
  secp256k1_modinv32_mul_cmp_30_cold_1();
  iVar10 = (int)a_02;
  piStack_398 = piVar20;
  psStack_390 = psVar43;
  uStack_388 = uVar48;
  uStack_378 = uVar53;
  pcStack_370 = (code *)puVar25;
  if (iVar10 < 1) {
    psStack_3a8 = (secp256k1_modinv32_signed30 *)0x14ba0a;
    secp256k1_modinv32_update_fg_30_var_cold_3();
LAB_0014ba0a:
    iVar13 = (int)piVar41;
    psStack_3a8 = (secp256k1_modinv32_signed30 *)0x14ba0f;
    secp256k1_modinv32_update_fg_30_var_cold_1();
  }
  else {
    iVar12 = piVar41[1];
    iVar1 = *piVar41;
    piVar20 = (int *)(long)psVar30->v[0];
    uVar14 = (long)*extraout_RDX * (long)iVar12 + (long)piVar20 * (long)iVar1;
    if ((uVar14 & 0x3fffffff) != 0) goto LAB_0014ba0a;
    iVar2 = piVar41[3];
    iVar13 = piVar41[2];
    piVar20 = (int *)((long)piVar20 * (long)iVar13);
    piVar41 = (int *)((long)*extraout_RDX * (long)iVar2 + (long)piVar20);
    if (((ulong)piVar41 & 0x3fffffff) == 0) {
      lVar8 = (long)piVar41 >> 0x1e;
      uVar6 = (long)uVar14 >> 0x1e;
      if (iVar10 != 1) {
        uVar53 = 1;
        do {
          lVar15 = (long)extraout_RDX[uVar53] * (long)iVar12 +
                   (long)psVar30->v[uVar53] * (long)iVar1 + uVar6;
          lVar8 = (long)extraout_RDX[uVar53] * (long)iVar2 +
                  (long)psVar30->v[uVar53] * (long)iVar13 + lVar8;
          psVar30->v[uVar53 - 1] = (uint)lVar15 & 0x3fffffff;
          extraout_RDX[uVar53 - 1] = (uint)lVar8 & 0x3fffffff;
          uVar53 = uVar53 + 1;
          lVar8 = lVar8 >> 0x1e;
          uVar6 = lVar15 >> 0x1e;
        } while (((ulong)a_02 & 0xffffffff) != uVar53);
      }
      psVar30->v[(long)iVar10 + -1] = (int32_t)uVar6;
      extraout_RDX[(long)iVar10 + -1] = (int)lVar8;
      return uVar6;
    }
  }
  psStack_3a8 = (secp256k1_modinv32_signed30 *)secp256k1_modinv32_mul_30;
  secp256k1_modinv32_update_fg_30_var_cold_2();
  lVar8 = 0;
  psStack_3a8 = (secp256k1_modinv32_signed30 *)0x0;
  do {
    if (lVar8 < extraout_EDX) {
      psStack_3a8 = (secp256k1_modinv32_signed30 *)
                    ((long)psStack_3a8->v + (long)psVar30->v[lVar8] * (long)iVar13);
    }
    a_02->v[lVar8] = (uint)psStack_3a8 & 0x3fffffff;
    psStack_3a8 = (secp256k1_modinv32_signed30 *)((long)psStack_3a8 >> 0x1e);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 8);
  if (8 < extraout_EDX) {
    psStack_3a8 = (secp256k1_modinv32_signed30 *)
                  ((long)psStack_3a8->v + (long)psVar30->v[8] * (long)iVar13);
  }
  b = (secp256k1_modinv32_signed30 *)(long)(int)psStack_3a8;
  if (b == psStack_3a8) {
    a_02->v[8] = (int)psStack_3a8;
    return (uint64_t)psStack_3a8;
  }
  pcStack_3b0 = secp256k1_modinv32_update_de_30;
  secp256k1_modinv32_mul_30_cold_1();
  uVar26 = *extraout_RDX_00;
  psVar49 = (secp256k1_modinv32_signed30 *)(long)(int)uVar26;
  uVar36 = extraout_RDX_00[1];
  lVar8 = (long)(int)uVar36;
  uVar38 = extraout_RDX_00[2];
  psVar21 = (secp256k1_modinv32_signed30 *)(long)(int)uVar38;
  lStack_3e8 = (long)(int)extraout_RDX_00[3];
  psVar31 = (secp256k1_fe *)0x9;
  pcStack_3f8 = (code *)0x14baa9;
  a_03 = a_02;
  piStack_3d8 = piVar20;
  psStack_3d0 = psVar43;
  uStack_3c8 = uVar48;
  uStack_3b8 = uVar53;
  pcStack_3b0 = (code *)puVar25;
  iVar10 = secp256k1_modinv32_mul_cmp_30(a_02,9,b,-2);
  if (iVar10 < 1) {
    pcStack_3f8 = (code *)0x14bd11;
    secp256k1_modinv32_update_de_30_cold_12();
LAB_0014bd11:
    pcStack_3f8 = (code *)0x14bd16;
    secp256k1_modinv32_update_de_30_cold_11();
LAB_0014bd16:
    pcStack_3f8 = (code *)0x14bd1b;
    secp256k1_modinv32_update_de_30_cold_10();
LAB_0014bd1b:
    pcStack_3f8 = (code *)0x14bd20;
    secp256k1_modinv32_update_de_30_cold_9();
LAB_0014bd20:
    pcStack_3f8 = (code *)0x14bd25;
    secp256k1_modinv32_update_de_30_cold_8();
LAB_0014bd25:
    pcStack_3f8 = (code *)0x14bd2a;
    secp256k1_modinv32_update_de_30_cold_7();
LAB_0014bd2a:
    pcStack_3f8 = (code *)0x14bd2f;
    secp256k1_modinv32_update_de_30_cold_1();
LAB_0014bd2f:
    pcStack_3f8 = (code *)0x14bd34;
    secp256k1_modinv32_update_de_30_cold_2();
    psVar44 = b;
LAB_0014bd34:
    pcStack_3f8 = (code *)0x14bd39;
    secp256k1_modinv32_update_de_30_cold_6();
LAB_0014bd39:
    pcStack_3f8 = (code *)0x14bd3e;
    secp256k1_modinv32_update_de_30_cold_5();
LAB_0014bd3e:
    pcStack_3f8 = (code *)0x14bd43;
    secp256k1_modinv32_update_de_30_cold_4();
  }
  else {
    psVar31 = (secp256k1_fe *)0x9;
    pcStack_3f8 = (code *)0x14bac6;
    a_03 = a_02;
    iVar10 = secp256k1_modinv32_mul_cmp_30(a_02,9,b,1);
    if (-1 < iVar10) goto LAB_0014bd11;
    psVar31 = (secp256k1_fe *)0x9;
    pcStack_3f8 = (code *)0x14bae3;
    a_03 = psVar30;
    iVar10 = secp256k1_modinv32_mul_cmp_30(psVar30,9,b,-2);
    if (iVar10 < 1) goto LAB_0014bd16;
    psVar31 = (secp256k1_fe *)0x9;
    pcStack_3f8 = (code *)0x14bb00;
    a_03 = psVar30;
    iVar10 = secp256k1_modinv32_mul_cmp_30(psVar30,9,b,1);
    if (-1 < iVar10) goto LAB_0014bd1b;
    psVar44 = (secp256k1_modinv32_signed30 *)-(long)psVar49;
    if (0 < (long)psVar49) {
      psVar44 = psVar49;
    }
    lVar15 = -lVar8;
    if (lVar8 < 1) {
      lVar15 = lVar8;
    }
    if (lVar15 + 0x40000000 < (long)psVar44) goto LAB_0014bd20;
    psVar44 = (secp256k1_modinv32_signed30 *)-(long)psVar21;
    if (0 < (long)psVar21) {
      psVar44 = psVar21;
    }
    lVar15 = -lStack_3e8;
    if (lStack_3e8 < 1) {
      lVar15 = lStack_3e8;
    }
    if (lVar15 + 0x40000000 < (long)psVar44) goto LAB_0014bd25;
    uVar18 = a_02->v[8] >> 0x1f;
    uVar4 = psVar30->v[8] >> 0x1f;
    psVar31 = (secp256k1_fe *)(ulong)uVar4;
    iVar10 = (uVar4 & uVar36) + (uVar18 & uVar26);
    a_03 = (secp256k1_modinv32_signed30 *)(psVar30->v[0] * lVar8 + (long)a_02->v[0] * (long)psVar49)
    ;
    lVar15 = (long)(int)(iVar10 - ((int)a_03 * b[1].v[0] + iVar10 & 0x3fffffffU));
    piVar17 = (int32_t *)((long)a_03->v + lVar15 * b->v[0]);
    if (((ulong)piVar17 & 0x3fffffff) != 0) goto LAB_0014bd2a;
    lStack_3e0 = lVar15;
    iVar10 = (uVar4 & (uint)lStack_3e8) + (uVar18 & uVar38);
    lVar16 = psVar30->v[0] * lStack_3e8 + (long)a_02->v[0] * (long)psVar21;
    a_03 = (secp256k1_modinv32_signed30 *)0x3fffffff;
    uVar26 = iVar10 - (b[1].v[0] * (int)lVar16 + iVar10 & 0x3fffffffU);
    psVar31 = (secp256k1_fe *)(ulong)uVar26;
    uVar53 = (long)b->v[0] * (long)(int)uVar26 + lVar16;
    if ((uVar53 & 0x3fffffff) != 0) goto LAB_0014bd2f;
    lVar16 = (long)uVar53 >> 0x1e;
    lVar29 = (long)piVar17 >> 0x1e;
    lVar34 = 1;
    do {
      lVar29 = b->v[lVar34] * lVar15 + psVar30->v[lVar34] * lVar8 +
               (long)a_02->v[lVar34] * (long)psVar49 + lVar29;
      psVar44 = (secp256k1_modinv32_signed30 *)(psVar30->v[lVar34] * lStack_3e8);
      lVar16 = (long)psVar44->v +
               (long)a_02->v[lVar34] * (long)psVar21 + lVar16 +
               (long)b->v[lVar34] * (long)(int)uVar26;
      a_02->v[lVar34 + -1] = (uint)lVar29 & 0x3fffffff;
      psVar30->v[lVar34 + -1] = (uint)lVar16 & 0x3fffffff;
      lVar34 = lVar34 + 1;
      lVar16 = lVar16 >> 0x1e;
      lVar29 = lVar29 >> 0x1e;
    } while (lVar34 != 9);
    a_02->v[8] = (int32_t)lVar29;
    psVar30->v[8] = (int32_t)lVar16;
    psVar31 = (secp256k1_fe *)0x9;
    pcStack_3f8 = (code *)0x14bcaa;
    a_03 = a_02;
    iVar10 = secp256k1_modinv32_mul_cmp_30(a_02,9,b,-2);
    psVar21 = psVar30;
    psVar49 = b;
    if (iVar10 < 1) goto LAB_0014bd34;
    psVar31 = (secp256k1_fe *)0x9;
    pcStack_3f8 = (code *)0x14bcc7;
    a_03 = a_02;
    iVar10 = secp256k1_modinv32_mul_cmp_30(a_02,9,b,1);
    if (-1 < iVar10) goto LAB_0014bd39;
    psVar31 = (secp256k1_fe *)0x9;
    pcStack_3f8 = (code *)0x14bce0;
    a_03 = psVar30;
    iVar10 = secp256k1_modinv32_mul_cmp_30(psVar30,9,b,-2);
    if (iVar10 < 1) goto LAB_0014bd3e;
    psVar31 = (secp256k1_fe *)0x9;
    pcStack_3f8 = (code *)0x14bcf9;
    a_03 = psVar30;
    iVar10 = secp256k1_modinv32_mul_cmp_30(psVar30,9,b,1);
    if (iVar10 < 0) {
      return CONCAT44(extraout_var,iVar10);
    }
  }
  pcStack_3f8 = secp256k1_modinv32_normalize_30;
  secp256k1_modinv32_update_de_30_cold_3();
  pcStack_3f8 = (code *)lVar8;
  psStack_400 = a_02;
  psStack_408 = psVar30;
  psStack_410 = psVar49;
  psStack_418 = psVar44;
  psStack_420 = psVar21;
  uVar26 = a_03->v[0];
  uVar35 = (ulong)uVar26;
  uVar36 = a_03->v[3];
  uVar7 = (ulong)uVar36;
  uVar38 = a_03->v[4];
  uVar14 = (ulong)uVar38;
  uVar4 = a_03->v[5];
  uVar48 = (ulong)uVar4;
  psVar30 = (secp256k1_modinv32_signed30 *)(ulong)(uint)a_03->v[6];
  uVar18 = a_03->v[7];
  uVar53 = (ulong)uVar18;
  iStack_424 = a_03->v[8];
  lVar8 = 0;
  do {
    if (a_03->v[lVar8] < -0x3fffffff) {
      pcStack_460 = (code *)0x14c091;
      secp256k1_modinv32_normalize_30_cold_7();
LAB_0014c091:
      pcStack_460 = (code *)0x14c096;
      secp256k1_modinv32_normalize_30_cold_6();
      goto LAB_0014c096;
    }
    if (0x3fffffff < a_03->v[lVar8]) goto LAB_0014c091;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 9);
  uStack_444 = (uint)psVar31;
  psVar31 = (secp256k1_fe *)0x9;
  pcStack_460 = (code *)0x14bdce;
  psVar30 = a_03;
  uStack_450 = a_03->v[1];
  uStack_44c = a_03->v[2];
  uStack_448 = a_03->v[6];
  psStack_440 = b_00;
  iVar10 = secp256k1_modinv32_mul_cmp_30(a_03,9,b_00,-2);
  if (iVar10 < 1) {
LAB_0014c096:
    pcStack_460 = (code *)0x14c09b;
    secp256k1_modinv32_normalize_30_cold_5();
LAB_0014c09b:
    pcStack_460 = (code *)0x14c0a0;
    secp256k1_modinv32_normalize_30_cold_4();
LAB_0014c0a0:
    pcStack_460 = (code *)0x14c0a5;
    secp256k1_modinv32_normalize_30_cold_3();
LAB_0014c0a5:
    pcStack_460 = (code *)0x14c0aa;
    secp256k1_modinv32_normalize_30_cold_2();
  }
  else {
    psVar31 = (secp256k1_fe *)0x9;
    pcStack_460 = (code *)0x14bded;
    psVar30 = a_03;
    iVar10 = secp256k1_modinv32_mul_cmp_30(a_03,9,psStack_440,1);
    if (-1 < iVar10) goto LAB_0014c09b;
    uVar27 = iStack_424 >> 0x1f;
    uStack_428 = psStack_440->v[1];
    uVar11 = (uVar27 & uStack_428) + uStack_450;
    uStack_450 = psStack_440->v[2];
    uVar40 = (uVar27 & uStack_450) + uStack_44c;
    uStack_44c = psStack_440->v[3];
    uStack_42c = psStack_440->v[4];
    uStack_430 = psStack_440->v[5];
    uStack_434 = psStack_440->v[6];
    uVar46 = (uVar27 & uStack_434) + uStack_448;
    uStack_448 = psStack_440->v[7];
    uStack_454 = (int)uStack_444 >> 0x1f;
    uStack_444 = psStack_440->v[8];
    uVar42 = ((uVar27 & psStack_440->v[0]) + uVar26 ^ uStack_454) - uStack_454;
    uVar23 = ((int)uVar42 >> 0x1e) + ((uVar11 ^ uStack_454) - uStack_454);
    uVar11 = ((int)uVar23 >> 0x1e) + ((uVar40 ^ uStack_454) - uStack_454);
    uVar50 = ((int)uVar11 >> 0x1e) + (((uVar27 & uStack_44c) + uVar36 ^ uStack_454) - uStack_454);
    uVar36 = ((int)uVar50 >> 0x1e) + (((uVar27 & uStack_42c) + uVar38 ^ uStack_454) - uStack_454);
    uVar26 = ((int)uVar36 >> 0x1e) + (((uVar27 & uStack_430) + uVar4 ^ uStack_454) - uStack_454);
    uVar38 = ((int)uVar26 >> 0x1e) + ((uVar46 ^ uStack_454) - uStack_454);
    uVar4 = ((int)uVar38 >> 0x1e) + (((uVar27 & uStack_448) + uVar18 ^ uStack_454) - uStack_454);
    uVar24 = ((int)uVar4 >> 0x1e) + (((uVar27 & uStack_444) + iStack_424 ^ uStack_454) - uStack_454)
    ;
    uVar48 = (ulong)uVar24;
    uStack_458 = (int)uVar24 >> 0x1f;
    uVar46 = (psStack_440->v[0] & uStack_458) + (uVar42 & 0x3fffffff);
    uVar40 = (uStack_430 & uStack_458) + (uVar26 & 0x3fffffff);
    uVar35 = (ulong)uVar40;
    uVar42 = (uStack_434 & uStack_458) + (uVar38 & 0x3fffffff);
    uVar7 = (ulong)uVar42;
    uVar26 = ((int)uVar46 >> 0x1e) + (uStack_428 & uStack_458) + (uVar23 & 0x3fffffff);
    uVar38 = ((int)uVar26 >> 0x1e) + (uStack_450 & uStack_458) + (uVar11 & 0x3fffffff);
    uVar18 = ((int)uVar38 >> 0x1e) + (uStack_44c & uStack_458) + (uVar50 & 0x3fffffff);
    uVar27 = ((int)uVar18 >> 0x1e) + (uStack_42c & uStack_458) + (uVar36 & 0x3fffffff);
    uVar40 = ((int)uVar27 >> 0x1e) + uVar40;
    uVar42 = ((int)uVar40 >> 0x1e) + uVar42;
    uVar36 = ((int)uVar42 >> 0x1e) + (uStack_448 & uStack_458) + (uVar4 & 0x3fffffff);
    uVar4 = ((int)uVar36 >> 0x1e) + (uStack_444 & uStack_458) + uVar24;
    uVar14 = (ulong)uVar4;
    uVar18 = uVar18 & 0x3fffffff;
    psVar31 = (secp256k1_fe *)(ulong)uVar18;
    uVar27 = uVar27 & 0x3fffffff;
    psVar30 = (secp256k1_modinv32_signed30 *)(ulong)uVar27;
    uVar36 = uVar36 & 0x3fffffff;
    uVar53 = (ulong)uVar36;
    a_03->v[0] = uVar46 & 0x3fffffff;
    a_03->v[1] = uVar26 & 0x3fffffff;
    a_03->v[2] = uVar38 & 0x3fffffff;
    a_03->v[3] = uVar18;
    a_03->v[4] = uVar27;
    a_03->v[5] = uVar40 & 0x3fffffff;
    a_03->v[6] = uVar42 & 0x3fffffff;
    a_03->v[7] = uVar36;
    a_03->v[8] = uVar4;
    if (0x3fffffff < uVar4) goto LAB_0014c0a0;
    psVar31 = (secp256k1_fe *)0x9;
    pcStack_460 = (code *)0x14c05e;
    psVar30 = a_03;
    iVar10 = secp256k1_modinv32_mul_cmp_30(a_03,9,psStack_440,0);
    if (iVar10 < 0) goto LAB_0014c0a5;
    psVar31 = (secp256k1_fe *)0x9;
    pcStack_460 = (code *)0x14c079;
    psVar30 = a_03;
    iVar10 = secp256k1_modinv32_mul_cmp_30(a_03,9,psStack_440,1);
    if (iVar10 < 0) {
      return CONCAT44(extraout_var_00,iVar10);
    }
  }
  pcStack_460 = test_inverse_field;
  secp256k1_modinv32_normalize_30_cold_1();
  r = &sStack_520;
  psVar22 = &sStack_520;
  pcVar45 = secp256k1_fe_inv_var;
  if (extraout_EDX_00 == 0) {
    pcVar45 = secp256k1_fe_inv;
  }
  pcStack_528 = (code *)0x14c0e0;
  uStack_488 = uVar53;
  uStack_480 = uVar48;
  uStack_478 = uVar7;
  psStack_470 = a_03;
  uStack_468 = uVar35;
  pcStack_460 = (code *)uVar14;
  (*pcVar45)(&sStack_520);
  if (psVar30 != (secp256k1_modinv32_signed30 *)0x0) {
    *(uint64_t *)(psVar30->v + 8) = sStack_520.n[4];
    *(ulong *)(psVar30[1].v + 1) = CONCAT44(sStack_520.normalized,sStack_520.magnitude);
    *(uint64_t *)(psVar30->v + 4) = sStack_520.n[2];
    *(uint64_t *)(psVar30->v + 6) = sStack_520.n[3];
    *(uint64_t *)psVar30->v = sStack_520.n[0];
    *(uint64_t *)(psVar30->v + 2) = sStack_520.n[1];
  }
  uVar14 = 0xffffffffffff;
  sStack_4c0.n[0] = psVar31->n[0];
  sStack_4c0.n[1] = psVar31->n[1];
  sStack_4c0.n[2] = psVar31->n[2];
  sStack_4c0.n[3] = psVar31->n[3];
  sStack_4c0.n[4] = psVar31->n[4];
  sStack_4c0.magnitude = psVar31->magnitude;
  sStack_4c0.normalized = psVar31->normalized;
  psVar32 = &sStack_4c0;
  pcStack_528 = (code *)0x14c149;
  secp256k1_fe_verify(psVar32);
  uVar53 = (sStack_4c0.n[4] >> 0x30) * 0x1000003d1 + sStack_4c0.n[0];
  if (((uVar53 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar53 & 0xfffffffffffff) == 0)) {
    uVar48 = (uVar53 >> 0x34) + sStack_4c0.n[1];
    uVar7 = (uVar48 >> 0x34) + sStack_4c0.n[2];
    uVar35 = (uVar7 >> 0x34) + sStack_4c0.n[3];
    uVar37 = (uVar35 >> 0x34) + (sStack_4c0.n[4] & 0xffffffffffff);
    if ((((uVar48 | uVar53 | uVar7 | uVar35) & 0xfffffffffffff) != 0 || uVar37 != 0) &&
       (((uVar53 | 0x1000003d0) & uVar48 & uVar7 & uVar35 & (uVar37 ^ 0xf000000000000)) !=
        0xfffffffffffff)) goto LAB_0014c1f0;
LAB_0014c5ba:
    pcStack_528 = (code *)0x14c5c5;
    secp256k1_fe_verify(&sStack_520);
    uVar14 = sStack_520.n[4] & 0xffffffffffff;
    uVar53 = (sStack_520.n[4] >> 0x30) * 0x1000003d1 + sStack_520.n[0];
    uVar48 = (uVar53 >> 0x34) + sStack_520.n[1];
    uVar7 = (uVar48 >> 0x34) + sStack_520.n[2];
    r = (secp256k1_fe *)((uVar7 >> 0x34) + sStack_520.n[3]);
    uVar35 = ((ulong)r >> 0x34) + uVar14;
    if (((uVar48 | uVar53 | uVar7 | (ulong)r) & 0xfffffffffffff) == 0 && uVar35 == 0) {
      return uVar53;
    }
    r_00 = (secp256k1_fe *)(uVar35 ^ 0xf000000000000);
    psVar22 = &sStack_520;
    if (((uVar53 ^ 0x1000003d0) & uVar48 & uVar7 & (ulong)r & (ulong)r_00) == 0xfffffffffffff) {
      return 0xfffffffffffff;
    }
  }
  else {
LAB_0014c1f0:
    pcStack_528 = (code *)0x14c203;
    psVar32 = psVar31;
    secp256k1_fe_mul(&sStack_4c0,psVar31,&sStack_520);
    pcStack_528 = (code *)0x14c20b;
    secp256k1_fe_verify(&sStack_4c0);
    r_00 = &fe_minus_one;
    pcStack_528 = (code *)0x14c217;
    secp256k1_fe_verify(&fe_minus_one);
    if (sStack_4c0.magnitude < 0x20) {
      sStack_4c0.n[0] = sStack_4c0.n[0] + 0xffffefffffc2e;
      sStack_4c0.n[1] = sStack_4c0.n[1] + 0xfffffffffffff;
      sStack_4c0.n[2] = sStack_4c0.n[2] + 0xfffffffffffff;
      sStack_4c0.n[3] = sStack_4c0.n[3] + 0xfffffffffffff;
      sStack_4c0.n[4] = sStack_4c0.n[4] + 0xffffffffffff;
      sStack_4c0.normalized = 0;
      sStack_4c0.magnitude = sStack_4c0.magnitude + 1;
      pcStack_528 = (code *)0x14c269;
      secp256k1_fe_verify(&sStack_4c0);
      pcStack_528 = (code *)0x14c271;
      secp256k1_fe_verify(&sStack_4c0);
      uVar53 = (sStack_4c0.n[4] >> 0x30) * 0x1000003d1 + sStack_4c0.n[0];
      uVar48 = (uVar53 >> 0x34) + sStack_4c0.n[1];
      uVar7 = (uVar48 >> 0x34) + sStack_4c0.n[2];
      psVar32 = (secp256k1_fe *)((uVar7 >> 0x34) + sStack_4c0.n[3]);
      uVar35 = ((ulong)psVar32 >> 0x34) + (sStack_4c0.n[4] & 0xffffffffffff);
      if ((((uVar48 | uVar53 | uVar7 | (ulong)psVar32) & 0xfffffffffffff) != 0 || uVar35 != 0) &&
         (r_00 = (secp256k1_fe *)(uVar35 ^ 0xf000000000000),
         ((uVar53 ^ 0x1000003d0) & uVar48 & uVar7 & (ulong)psVar32 & (ulong)r_00) != 0xfffffffffffff
         )) goto LAB_0014c658;
      sStack_4f0.n[0] = psVar31->n[0];
      sStack_4f0.n[1] = psVar31->n[1];
      sStack_4f0.n[2] = psVar31->n[2];
      sStack_4f0.n[3] = psVar31->n[3];
      sStack_4f0.n[4] = psVar31->n[4];
      sStack_4f0.magnitude = psVar31->magnitude;
      sStack_4f0.normalized = psVar31->normalized;
      psVar31 = &sStack_4f0;
      pcStack_528 = (code *)0x14c317;
      secp256k1_fe_verify(psVar31);
      r_00 = &fe_minus_one;
      pcStack_528 = (code *)0x14c323;
      secp256k1_fe_verify(&fe_minus_one);
      if (0x1f < sStack_4f0.magnitude) goto LAB_0014c65d;
      sStack_4f0.n[0] = sStack_4f0.n[0] + 0xffffefffffc2e;
      sStack_4f0.n[1] = sStack_4f0.n[1] + 0xfffffffffffff;
      sStack_4f0.n[2] = sStack_4f0.n[2] + 0xfffffffffffff;
      sStack_4f0.n[3] = sStack_4f0.n[3] + 0xfffffffffffff;
      sStack_4f0.n[4] = sStack_4f0.n[4] + 0xffffffffffff;
      sStack_4f0.normalized = 0;
      sStack_4f0.magnitude = sStack_4f0.magnitude + 1;
      pcStack_528 = (code *)0x14c36e;
      secp256k1_fe_verify(&sStack_4f0);
      pcStack_528 = (code *)0x14c376;
      secp256k1_fe_verify(&sStack_4f0);
      uVar53 = (sStack_4f0.n[4] >> 0x30) * 0x1000003d1 + sStack_4f0.n[0];
      if (((uVar53 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar53 & 0xfffffffffffff) == 0)) {
        uVar48 = (uVar53 >> 0x34) + sStack_4f0.n[1];
        uVar7 = (uVar48 >> 0x34) + sStack_4f0.n[2];
        uVar35 = (uVar7 >> 0x34) + sStack_4f0.n[3];
        uVar37 = (uVar35 >> 0x34) + (sStack_4f0.n[4] & 0xffffffffffff);
        if (((uVar48 | uVar53 | uVar7 | uVar35) & 0xfffffffffffff) == 0 && uVar37 == 0) {
          return uVar53;
        }
        if (((uVar53 | 0x1000003d0) & uVar48 & uVar7 & uVar35 & (uVar37 ^ 0xf000000000000)) ==
            0xfffffffffffff) {
          return 0xfffffffffffff;
        }
      }
      psVar32 = &sStack_4f0;
      pcStack_528 = (code *)0x14c425;
      (*pcVar45)();
      pcStack_528 = (code *)0x14c430;
      secp256k1_fe_verify(&sStack_520);
      r_00 = &fe_minus_one;
      pcStack_528 = (code *)0x14c43c;
      secp256k1_fe_verify(&fe_minus_one);
      psVar31 = &sStack_520;
      if (0x1f < sStack_520.magnitude) goto LAB_0014c662;
      sStack_520.n[0] = sStack_520.n[0] + 0xffffefffffc2e;
      sStack_520.n[1] = sStack_520.n[1] + 0xfffffffffffff;
      sStack_520.n[2] = sStack_520.n[2] + 0xfffffffffffff;
      sStack_520.n[3] = sStack_520.n[3] + 0xfffffffffffff;
      sStack_520.n[4] = sStack_520.n[4] + 0xffffffffffff;
      sStack_520.magnitude = sStack_520.magnitude + 1;
      sStack_520.normalized = 0;
      pcStack_528 = (code *)0x14c485;
      secp256k1_fe_verify(&sStack_520);
      pcStack_528 = (code *)0x14c48e;
      (*pcVar45)(&sStack_520);
      pcStack_528 = (code *)0x14c496;
      secp256k1_fe_verify(&sStack_520);
      sStack_520.n[0] = sStack_520.n[0] + 1;
      sStack_520.magnitude = sStack_520.magnitude + 1;
      sStack_520.normalized = 0;
      pcStack_528 = (code *)0x14c4a8;
      secp256k1_fe_verify(&sStack_520);
      pcStack_528 = (code *)0x14c4b0;
      secp256k1_fe_verify(&sStack_520);
      psVar32 = &sStack_4f0;
      pcStack_528 = (code *)0x14c4bd;
      r_00 = psVar32;
      secp256k1_fe_verify(psVar32);
      if (sStack_4f0.magnitude + sStack_520.magnitude < 0x21) {
        sStack_520.n[0] = sStack_520.n[0] + sStack_4f0.n[0];
        sStack_520.n[1] = sStack_520.n[1] + sStack_4f0.n[1];
        sStack_520.n[2] = sStack_520.n[2] + sStack_4f0.n[2];
        sStack_520.n[3] = sStack_520.n[3] + sStack_4f0.n[3];
        sStack_520.n[4] = sStack_520.n[4] + sStack_4f0.n[4];
        sStack_520.normalized = 0;
        pcStack_528 = (code *)0x14c509;
        sStack_520.magnitude = sStack_4f0.magnitude + sStack_520.magnitude;
        secp256k1_fe_verify(&sStack_520);
        pcStack_528 = (code *)0x14c511;
        secp256k1_fe_verify(&sStack_520);
        uVar53 = (sStack_520.n[4] >> 0x30) * 0x1000003d1 + sStack_520.n[0];
        if (((uVar53 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar53 & 0xfffffffffffff) == 0)) {
          uVar14 = (uVar53 >> 0x34) + sStack_520.n[1];
          uVar48 = (uVar14 >> 0x34) + sStack_520.n[2];
          uVar7 = (uVar48 >> 0x34) + sStack_520.n[3];
          uVar35 = (uVar7 >> 0x34) + (sStack_520.n[4] & 0xffffffffffff);
          if (((uVar14 | uVar53 | uVar48 | uVar7) & 0xfffffffffffff) == 0 && uVar35 == 0) {
            return uVar53;
          }
          if (((uVar53 | 0x1000003d0) & uVar14 & uVar48 & uVar7 & (uVar35 ^ 0xf000000000000)) ==
              0xfffffffffffff) {
            return 0xfffffffffffff;
          }
        }
        pcStack_528 = (code *)0x14c5ba;
        test_inverse_field_cold_2();
        goto LAB_0014c5ba;
      }
    }
    else {
      pcStack_528 = (code *)0x14c658;
      test_inverse_field_cold_7();
LAB_0014c658:
      pcStack_528 = (code *)0x14c65d;
      test_inverse_field_cold_6();
LAB_0014c65d:
      pcStack_528 = (code *)0x14c662;
      test_inverse_field_cold_5();
LAB_0014c662:
      r = psVar32;
      psVar22 = psVar31;
      psVar32 = &sStack_4c0;
      pcStack_528 = (code *)0x14c667;
      test_inverse_field_cold_4();
    }
    pcStack_528 = (code *)0x14c66c;
    test_inverse_field_cold_3();
  }
  pcStack_528 = test_inverse_scalar;
  test_inverse_field_cold_1();
  pcStack_528 = (code *)0xfffffffffffff;
  psVar31 = (secp256k1_fe *)auStack_598;
  pcVar54 = secp256k1_scalar_inverse_var;
  if (extraout_EDX_01 == 0) {
    pcVar54 = secp256k1_scalar_inverse;
  }
  pcStack_5a0 = (code *)0x14c69a;
  auStack_558._32_8_ = psVar22;
  auStack_558._40_8_ = psVar32;
  (*pcVar54)(auStack_598);
  if (r_00 != (secp256k1_fe *)0x0) {
    r_00->n[2] = CONCAT44(auStack_598._20_4_,auStack_598._16_4_);
    r_00->n[3] = CONCAT44(auStack_598._28_4_,auStack_598._24_4_);
    r_00->n[0] = CONCAT44(auStack_598._4_4_,auStack_598._0_4_);
    r_00->n[1] = CONCAT44(auStack_598._12_4_,auStack_598._8_4_);
  }
  pcStack_5a0 = (code *)0x14c6b9;
  secp256k1_scalar_verify((secp256k1_scalar *)r);
  auVar59._0_4_ = -(uint)((int)r->n[2] == 0 && (int)r->n[0] == 0);
  auVar59._4_4_ = -(uint)(*(int *)((long)r->n + 0x14) == 0 && *(int *)((long)r->n + 4) == 0);
  auVar59._8_4_ = -(uint)((int)r->n[3] == 0 && (int)r->n[1] == 0);
  auVar59._12_4_ = -(uint)(*(int *)((long)r->n + 0x1c) == 0 && *(int *)((long)r->n + 0xc) == 0);
  iVar10 = movmskps(extraout_EAX,auVar59);
  if (iVar10 != 0xf) {
    r_00 = (secp256k1_fe *)auStack_558;
    pcStack_5a0 = (code *)0x14c6ed;
    secp256k1_scalar_mul
              ((secp256k1_scalar *)r_00,(secp256k1_scalar *)r,(secp256k1_scalar *)auStack_598);
    pcStack_5a0 = (code *)0x14c6f5;
    psVar22 = r_00;
    secp256k1_scalar_verify((secp256k1_scalar *)r_00);
    if (((auStack_558._0_8_ != 1 || auStack_558._8_8_ != 0) || auStack_558._16_8_ != 0) ||
        auStack_558._24_8_ != 0) {
      pcStack_5a0 = (code *)0x14c7ff;
      test_inverse_scalar_cold_1();
      goto LAB_0014c7ff;
    }
    pcStack_5a0 = (code *)0x14c725;
    secp256k1_scalar_add
              ((secp256k1_scalar *)(auStack_598 + 0x20),(secp256k1_scalar *)r,&scalar_minus_one);
    pcStack_5a0 = (code *)0x14c72d;
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_598 + 0x20));
    auVar56._0_4_ = -(uint)(iStack_568 == 0 && auStack_598._32_4_ == 0);
    auVar56._4_4_ = -(uint)(iStack_564 == 0 && iStack_574 == 0);
    auVar56._8_4_ = -(uint)(iStack_560 == 0 && iStack_570 == 0);
    auVar56._12_4_ = -(uint)(iStack_55c == 0 && iStack_56c == 0);
    uVar26 = movmskps(extraout_EAX_00,auVar56);
    if ((uVar26 ^ 0xf) == 0) {
      return (ulong)(uVar26 ^ 0xf);
    }
    a = (secp256k1_scalar *)(auStack_598 + 0x20);
    pcStack_5a0 = (code *)0x14c75e;
    (*pcVar54)(a,a);
    pcStack_5a0 = (code *)0x14c773;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_598,&scalar_minus_one,(secp256k1_scalar *)auStack_598);
    pcStack_5a0 = (code *)0x14c77c;
    (*pcVar54)(auStack_598,auStack_598);
    pcStack_5a0 = (code *)0x14c78e;
    secp256k1_scalar_add
              ((secp256k1_scalar *)auStack_598,(secp256k1_scalar *)auStack_598,&secp256k1_scalar_one
              );
    pcStack_5a0 = (code *)0x14c79c;
    secp256k1_scalar_add((secp256k1_scalar *)auStack_598,a,(secp256k1_scalar *)auStack_598);
    pcStack_5a0 = (code *)0x14c7a4;
    secp256k1_scalar_verify((secp256k1_scalar *)auStack_598);
    auVar57._0_4_ = -(uint)(auStack_598._16_4_ == 0 && auStack_598._0_4_ == 0);
    auVar57._4_4_ = -(uint)(auStack_598._20_4_ == 0 && auStack_598._4_4_ == 0);
    auVar57._8_4_ = -(uint)(auStack_598._24_4_ == 0 && auStack_598._8_4_ == 0);
    auVar57._12_4_ = -(uint)(auStack_598._28_4_ == 0 && auStack_598._12_4_ == 0);
    uVar26 = movmskps(extraout_EAX_01,auVar57);
    if ((uVar26 ^ 0xf) == 0) {
      return (ulong)(uVar26 ^ 0xf);
    }
    pcStack_5a0 = (code *)0x14c7c8;
    test_inverse_scalar_cold_2();
    r_00 = (secp256k1_fe *)auStack_598;
  }
  pcStack_5a0 = (code *)0x14c7d3;
  secp256k1_scalar_verify((secp256k1_scalar *)auStack_598);
  auVar58._0_4_ = -(uint)(auStack_598._16_4_ == 0 && auStack_598._0_4_ == 0);
  auVar58._4_4_ = -(uint)(auStack_598._20_4_ == 0 && auStack_598._4_4_ == 0);
  auVar58._8_4_ = -(uint)(auStack_598._24_4_ == 0 && auStack_598._8_4_ == 0);
  auVar58._12_4_ = -(uint)(auStack_598._28_4_ == 0 && auStack_598._12_4_ == 0);
  uVar26 = movmskps(extraout_EAX_02,auVar58);
  r = (secp256k1_fe *)auStack_598;
  psVar22 = psVar31;
  if ((uVar26 ^ 0xf) == 0) {
    return (ulong)(uVar26 ^ 0xf);
  }
LAB_0014c7ff:
  pcStack_5a0 = test_hsort;
  test_inverse_scalar_cold_3();
  uStack_5b8 = 0x1000003d1;
  __s = auStack_1650;
  psStack_5c8 = r;
  pcStack_5c0 = pcVar45;
  psStack_5b0 = r_00;
  pcStack_5a8 = pcVar54;
  pcStack_5a0 = (code *)uVar14;
  memset(__s,0,0x1081);
  uStack_1660 = 0;
  lVar8 = 0x41;
  psStack_1658 = psVar22;
  secp256k1_hsort(__s,0x41,(size_t)psVar22,test_hsort_cmp,&uStack_1660);
  if (0x3f < uStack_1660) {
    test_hsort_is_sorted(auStack_1650,0x41,(size_t)psVar22);
    uVar6 = extraout_RAX;
    if (0 < COUNT) {
      iVar10 = 0;
      do {
        uVar5 = testrand_int(0x41);
        count = (size_t)(int)uVar5;
        testrand_bytes_test(auStack_1650,count * (long)psVar22);
        secp256k1_hsort(auStack_1650,count,(size_t)psVar22,test_hsort_cmp,&uStack_1660);
        test_hsort_is_sorted(auStack_1650,count,(size_t)psVar22);
        iVar10 = iVar10 + 1;
        uVar6 = extraout_RAX_00;
      } while (iVar10 < COUNT);
    }
    return uVar6;
  }
  test_hsort_cold_1();
  *extraout_RDX_01 = *extraout_RDX_01 + 1;
  if (extraout_RDX_01[1] != 0) {
    lVar15 = 0;
    do {
      if (__s[lVar15] != *(byte *)(lVar8 + lVar15)) {
        return (ulong)((uint)__s[lVar15] - (uint)*(byte *)(lVar8 + lVar15));
      }
      lVar15 = lVar15 + 1;
    } while (extraout_RDX_01[1] != lVar15);
  }
  return 0;
}

Assistant:

static uint64_t modinv2p64(uint64_t x) {
    /* If w = 1/x mod 2^(2^L), then w*(2 - w*x) = 1/x mod 2^(2^(L+1)). See
     * Hacker's Delight second edition, Henry S. Warren, Jr., pages 245-247 for
     * why. Start with L=0, for which it is true for every odd x that
     * 1/x=1 mod 2. Iterating 6 times gives us 1/x mod 2^64. */
    int l;
    uint64_t w = 1;
    CHECK(x & 1);
    for (l = 0; l < 6; ++l) w *= (2 - w*x);
    return w;
}